

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmArea.c
# Opt level: O2

Vec_Int_t * Abc_NtkPrecomputeCellPairs(Mio_Cell2_t *pCells,int nCells)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  word wVar4;
  ulong uVar5;
  int iVar6;
  Vec_Int_t *p;
  int *piVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint Entry;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  long lVar18;
  word wVar19;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  ulong local_e8;
  int Perm [7];
  int nPerms [7];
  int *pPerm [7];
  ulong uVar17;
  
  p = Vec_IntAlloc(1000);
  for (lVar18 = 1; lVar18 != 7; lVar18 = lVar18 + 1) {
    piVar7 = Extra_PermSchedule((int)lVar18);
    pPerm[lVar18] = piVar7;
  }
  for (lVar18 = 1; lVar18 != 7; lVar18 = lVar18 + 1) {
    iVar6 = Extra_Factorial((int)lVar18);
    nPerms[lVar18] = iVar6;
  }
  iVar6 = 0;
  uVar14 = 2;
  local_120 = -1;
  local_11c = local_120;
  do {
    lVar18 = 1;
    if ((long)nCells <= (long)uVar14) {
      for (; lVar18 != 7; lVar18 = lVar18 + 1) {
        if (pPerm[lVar18] != (int *)0x0) {
          free(pPerm[lVar18]);
          pPerm[lVar18] = (int *)0x0;
        }
      }
      if (iVar6 != 0) {
        printf("In this library, %d cell pairs have equal functions (for example, %s and %s).\n",
               (long)iVar6 / 2 & 0xffffffff,pCells[local_120].pName,pCells[local_11c].pName);
      }
      return p;
    }
    uVar16 = *(uint *)&pCells[uVar14].field_0x10 >> 0x1c;
    uVar17 = (ulong)uVar16;
    for (uVar13 = 0; uVar13 != uVar16 + 1; uVar13 = uVar13 + 1) {
      uVar3 = pCells[uVar14].uTruth;
      if (uVar13 == uVar17) {
        uVar15 = ~uVar3;
      }
      else {
        bVar9 = (byte)(1 << ((byte)uVar13 & 0x1f));
        uVar15 = (s_Truths6[uVar13] & uVar3) >> (bVar9 & 0x3f) |
                 uVar3 << (bVar9 & 0x3f) & s_Truths6[uVar13];
      }
      local_118 = -1;
      Entry = 0xffffffff;
      local_e8 = 0xffffffffffffffff;
      local_114 = local_118;
      for (uVar10 = 2; uVar10 != (uint)nCells; uVar10 = uVar10 + 1) {
        if (uVar16 == *(uint *)&pCells[uVar10].field_0x10 >> 0x1c) {
          if ((uVar14 == uVar10) || (uVar3 != pCells[uVar10].uTruth)) {
            for (uVar8 = 0; uVar17 != uVar8; uVar8 = uVar8 + 1) {
              Perm[uVar8] = (int)uVar8;
            }
            wVar4 = pCells[uVar10].uTruth;
            uVar1 = nPerms[uVar17];
            uVar8 = 0;
            if (0 < (int)uVar1) {
              uVar8 = (ulong)uVar1;
            }
            wVar19 = wVar4;
            for (uVar12 = 0; uVar12 != uVar8; uVar12 = uVar12 + 1) {
              if ((uVar15 == wVar19) && (uVar5 = pCells[uVar10].AreaW, uVar5 < local_e8)) {
                Entry = 0;
                for (uVar11 = 0; uVar17 != uVar11; uVar11 = uVar11 + 1) {
                  Entry = Entry | (int)uVar11 << ((*(byte *)(Perm + uVar11) & 7) << 2);
                }
                local_114 = (int)pCells[uVar14].AreaW - (int)uVar5;
                local_118 = (int)uVar10;
                local_e8 = uVar5;
              }
              if (uVar1 != 1) {
                iVar2 = pPerm[uVar17][uVar12];
                bVar9 = (byte)(1L << ((byte)iVar2 & 0x3f));
                wVar19 = (wVar19 & s_PMasks[iVar2][2]) >> (bVar9 & 0x3f) |
                         (s_PMasks[iVar2][1] & wVar19) << (bVar9 & 0x3f) |
                         s_PMasks[iVar2][0] & wVar19;
                *(ulong *)(Perm + iVar2) =
                     CONCAT44((int)*(undefined8 *)(Perm + iVar2),
                              (int)((ulong)*(undefined8 *)(Perm + iVar2) >> 0x20));
              }
            }
            if (wVar19 != wVar4) {
              __assert_fail("tCur == pCells[k].uTruth",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmArea.c"
                            ,0x6f,"Vec_Int_t *Abc_NtkPrecomputeCellPairs(Mio_Cell2_t *, int)");
            }
          }
          else {
            iVar6 = iVar6 + 1;
            local_120 = (int)uVar14;
            local_11c = (int)uVar10;
          }
        }
      }
      Vec_IntPush(p,local_118);
      Vec_IntPush(p,Entry);
      Vec_IntPush(p,local_114);
    }
    uVar14 = uVar14 + 1;
  } while( true );
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Precompute cell parameters.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Abc_NtkPrecomputeCellPairs( Mio_Cell2_t * pCells, int nCells )
{
    Vec_Int_t * vInfo = Vec_IntAlloc( 1000 );
    word iBestArea, tCur, iThis;
    int * pPerm[7], nPerms[7], Perm[7], * Perm1, * Perm2;
    int iBestCell, iBestPerm, iBestDiff;
    int i, k, n, v, p, Count = 0;
    int iGate1 = -1, iGate2 = -1;

    for ( i = 1; i <= 6; i++ )
        pPerm[i] = Extra_PermSchedule( i );
    for ( i = 1; i <= 6; i++ )
        nPerms[i] = Extra_Factorial( i );

    for ( i = 2; i < nCells; i++ )
    {
        int nFanins = pCells[i].nFanins;
        for ( n = 0; n <= nFanins; n++ )
        {
            // get the truth table
            iThis = (n == nFanins) ? ~pCells[i].uTruth : Abc_Tt6Flip(pCells[i].uTruth, n);
            // init the comparison
            iBestArea = ~((word)0);
            iBestCell = iBestPerm = iBestDiff = -1;
            // iterate through cells
            for ( k = 2; k < nCells; k++ )
            {
                if ( nFanins != (int)pCells[k].nFanins )
                    continue;
                if ( i != k && pCells[i].uTruth == pCells[k].uTruth )
                {
                    iGate1 = i;
                    iGate2 = k;
                    Count++;
                    continue;
                }
                // set unit permutation
                for ( v = 0; v < nFanins; v++ )
                    Perm[v] = v;
                // go through all permutation of Cell[k]
                tCur = pCells[k].uTruth;
                for ( p = 0; p < nPerms[nFanins]; p++ )
                {
                    if ( iThis == tCur && iBestArea > pCells[k].AreaW ) 
                    {
                        iBestArea = pCells[k].AreaW;
                        iBestCell = k;
                        iBestPerm = 0;
                        for ( v = 0; v < nFanins; v++ )
                            iBestPerm |= (v << (Perm[v] << 2));
                        iBestDiff = (pCells[i].AreaW >= pCells[k].AreaW) ? (int)(pCells[i].AreaW - pCells[k].AreaW) : -(int)(pCells[k].AreaW - pCells[i].AreaW);
                    }
                    if ( nPerms[nFanins] == 1 )
                        continue;
                    // update
                    tCur  = Abc_Tt6SwapAdjacent( tCur, pPerm[nFanins][p] );
                    Perm1 = Perm + pPerm[nFanins][p];
                    Perm2 = Perm1 + 1;
                    ABC_SWAP( int, *Perm1, *Perm2 );
                }
                assert( tCur == pCells[k].uTruth );
            }
            Vec_IntPushThree( vInfo, iBestCell, iBestPerm, iBestDiff );
        }
    }

    for ( i = 1; i <= 6; i++ )
        ABC_FREE( pPerm[i] );
    if ( Count )
        printf( "In this library, %d cell pairs have equal functions (for example, %s and %s).\n", Count/2, pCells[iGate1].pName, pCells[iGate2].pName );
    return vInfo;
}